

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*,unsigned_int,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ImmutableSamplerDesc&)>
          (Serializer<(Diligent::SerializerMode)0> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **DstArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)0>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  bool bVar1;
  Char *pCVar2;
  ImmutableSamplerDesc *pIVar3;
  ulong uVar4;
  char (*Args_1) [20];
  ulong local_98;
  size_t i;
  ImmutableSamplerDesc *pDstElements;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  _func_bool_Serializer<(Diligent::SerializerMode)0>_ptr_ImmutableSamplerDesc_ptr
  *ElemSerializer_local;
  uint *Count_local;
  ImmutableSamplerDesc **DstArray_local;
  DynamicLinearAllocator *Allocator_local;
  Serializer<(Diligent::SerializerMode)0> *this_local;
  
  Args_1 = (char (*) [20])Count;
  msg.field_2._8_8_ = ElemSerializer;
  if (Allocator == (DynamicLinearAllocator *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcd2367,
               (char (*) [21])Count);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (char (*) [20])0x1d3;
    DebugAssertionFailed
              (pCVar2,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1d3);
    std::__cxx11::string::~string((string *)local_58);
  }
  if (*DstArray != (ImmutableSamplerDesc *)0x0) {
    FormatString<char[26],char[20]>
              ((string *)&pDstElements,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DstArray == nullptr",Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1d4);
    std::__cxx11::string::~string((string *)&pDstElements);
  }
  bVar1 = operator()(this,Count);
  if (bVar1) {
    pIVar3 = DynamicLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                       (Allocator,(ulong)*Count);
    for (local_98 = 0; local_98 < *Count; local_98 = local_98 + 1) {
      uVar4 = (*(code *)msg.field_2._8_8_)(this,pIVar3 + local_98);
      if ((uVar4 & 1) == 0) {
        return false;
      }
    }
    *DstArray = pIVar3;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Serializer<SerializerMode::Read>::SerializeArray(DynamicLinearAllocator* Allocator,
                                                      ElemPtrType&            DstArray,
                                                      CountType&              Count,
                                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR(Allocator != nullptr);
    VERIFY_EXPR(DstArray == nullptr);

    if (!(*this)(Count))
        return false;

    auto* pDstElements = Allocator->ConstructArray<RawType<decltype(DstArray[0])>>(Count);
    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, pDstElements[i]))
            return false;
    }
    DstArray = pDstElements;

    return true;
}